

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::DebuggerScope::GetPropertyIndex(DebuggerScope *this,PropertyId propertyId,int *index)

{
  DebuggerScopeProperty *pDVar1;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  ulong uVar3;
  RegSlot RVar4;
  ulong uVar5;
  DebuggerScopeProperty *pDVar6;
  DebuggerScopeProperty *pDVar7;
  bool bVar8;
  
  pLVar2 = (this->scopeProperties).ptr;
  RVar4 = 0xffffffff;
  if ((pLVar2 == (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0) ||
     ((pLVar2->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
      count < 1)) {
    bVar8 = false;
  }
  else {
    uVar5 = (ulong)(pLVar2->
                   super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>)
                   .count;
    if ((long)uVar5 < 1) {
      return 0 < (long)uVar5;
    }
    pDVar7 = (pLVar2->
             super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
             buffer.ptr;
    bVar8 = true;
    if (pDVar7->propId != propertyId) {
      uVar3 = 0;
      pDVar6 = pDVar7;
      do {
        if (uVar5 - 1 == uVar3) {
          return false;
        }
        pDVar7 = pDVar6 + 1;
        uVar3 = uVar3 + 1;
        pDVar1 = pDVar6 + 1;
        pDVar6 = pDVar7;
      } while (pDVar1->propId != propertyId);
      bVar8 = uVar3 < uVar5;
    }
    RVar4 = pDVar7->location;
  }
  *index = RVar4;
  return bVar8;
}

Assistant:

bool DebuggerScope::GetPropertyIndex(Js::PropertyId propertyId, int& index)
    {
        if (!this->HasProperties())
        {
            index = -1;
            return false;
        }

        bool found = this->scopeProperties->MapUntil( [&](int i, const DebuggerScopeProperty& scopeProperty) {
            if(scopeProperty.propId == propertyId)
            {
                index = scopeProperty.location;
                return true;
            }
            return false;
        });

        if(!found)
        {
            return false;
        }
        return true;
    }